

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

Result init_audio_buffer(Emulator *e,u32 frequency,u32 frames)

{
  u8 *puVar1;
  ulong __size;
  
  (e->audio_buffer).frames = frames;
  __size = (ulong)(frames * 2 + 0x200);
  puVar1 = (u8 *)malloc(__size);
  (e->audio_buffer).data = puVar1;
  if (puVar1 == (u8 *)0x0) {
    init_audio_buffer_cold_1();
  }
  else {
    (e->audio_buffer).end = puVar1 + __size;
    (e->audio_buffer).position = puVar1;
    (e->audio_buffer).frequency = frequency;
  }
  return (uint)(puVar1 == (u8 *)0x0);
}

Assistant:

Result init_audio_buffer(Emulator* e, u32 frequency, u32 frames) {
  AudioBuffer* audio_buffer = &e->audio_buffer;
  audio_buffer->frames = frames;
  size_t buffer_size =
      (frames + AUDIO_BUFFER_EXTRA_FRAMES) * SOUND_OUTPUT_COUNT;
  audio_buffer->data = xmalloc(buffer_size);
  CHECK_MSG(audio_buffer->data != NULL, "Audio buffer allocation failed.\n");
  audio_buffer->end = audio_buffer->data + buffer_size;
  audio_buffer->position = audio_buffer->data;
  audio_buffer->frequency = frequency;
  return OK;
  ON_ERROR_RETURN;
}